

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaTrFunc.cpp
# Opt level: O0

void __thiscall NaPolyFrac::Save(NaPolyFrac *this,NaDataStream *ds)

{
  uint uVar1;
  size_t sVar2;
  NaDataStream *in_RSI;
  long in_RDI;
  char szBuf [1025];
  uint i;
  uint in_stack_fffffffffffffbac;
  NaVector *in_stack_fffffffffffffbb0;
  NaVector *this_00;
  NaVector local_418 [6];
  uint local_14;
  
  memset(local_418,0,0x401);
  local_14 = 0;
  while( true ) {
    uVar1 = NaVector::dim((NaVector *)(in_RDI + 0x40));
    if (uVar1 <= local_14) break;
    sVar2 = strlen((char *)local_418);
    NaVector::operator()(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
    sprintf((char *)((long)&local_418[0]._vptr_NaVector + sVar2)," %g");
    local_14 = local_14 + 1;
  }
  strcat((char *)local_418," / ");
  local_14 = 0;
  while( true ) {
    uVar1 = NaVector::dim((NaVector *)(in_RDI + 0x58));
    if (uVar1 <= local_14) break;
    this_00 = local_418;
    sVar2 = strlen((char *)local_418);
    NaVector::operator()(this_00,in_stack_fffffffffffffbac);
    sprintf((char *)((long)&this_00->_vptr_NaVector + sVar2)," %g");
    local_14 = local_14 + 1;
  }
  NaDataStream::PutF(in_RSI,"num/den","%s",local_418);
  return;
}

Assistant:

void
NaPolyFrac::Save (NaDataStream& ds)
{
    unsigned    i;
    char        szBuf[MaxConfigFileLine+1] = "";

    // numerator
    for(i = 0; i < num.dim(); ++i){
        sprintf(szBuf + strlen(szBuf), " %g", num(i));
    }

    // delimiter
    strcat(szBuf, " / ");

    // denumerator
    for(i = 0; i < den.dim(); ++i){
        sprintf(szBuf + strlen(szBuf), " %g", den(i));
    }

    ds.PutF("num/den", "%s", szBuf);
}